

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void discharge2reg(FuncState *fs,expdesc *e,int reg)

{
  uint n;
  uint *puVar1;
  uint in_EDX;
  int *in_RSI;
  long *in_RDI;
  Instruction *pc;
  int a;
  expdesc *in_stack_ffffffffffffffc8;
  OpCode o;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar2;
  FuncState *in_stack_ffffffffffffffe0;
  
  luaK_dischargevars((FuncState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
  n = *in_RSI - 1;
  a = (int)in_stack_ffffffffffffffc8;
  o = (OpCode)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  switch((ulong)n) {
  case 0:
    luaK_nil(in_stack_ffffffffffffffe0,0,n);
    break;
  case 1:
  case 2:
    luaK_codeABC((FuncState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),o,a,0,
                 0x116c2d);
    break;
  case 3:
    luaK_codeABx((FuncState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),o,a,0);
    break;
  case 4:
    uVar2 = in_EDX;
    luaK_numberK(in_stack_ffffffffffffffe0,(lua_Number)(ulong)n);
    luaK_codeABx((FuncState *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                 (OpCode)((ulong)in_RDI >> 0x20),(int)in_RDI,0);
    break;
  default:
    return;
  case 10:
    puVar1 = (uint *)(*(long *)(*in_RDI + 0x18) + (long)in_RSI[2] * 4);
    *puVar1 = *puVar1 & 0xffffc03f | (in_EDX & 0xff) << 6;
    break;
  case 0xb:
    if (in_EDX != in_RSI[2]) {
      luaK_codeABC((FuncState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),o,a,0,
                   0x116cfc);
    }
  }
  in_RSI[2] = in_EDX;
  *in_RSI = 0xc;
  return;
}

Assistant:

static void discharge2reg(FuncState*fs,expdesc*e,int reg){
luaK_dischargevars(fs,e);
switch(e->k){
case VNIL:{
luaK_nil(fs,reg,1);
break;
}
case VFALSE:case VTRUE:{
luaK_codeABC(fs,OP_LOADBOOL,reg,e->k==VTRUE,0);
break;
}
case VK:{
luaK_codeABx(fs,OP_LOADK,reg,e->u.s.info);
break;
}
case VKNUM:{
luaK_codeABx(fs,OP_LOADK,reg,luaK_numberK(fs,e->u.nval));
break;
}
case VRELOCABLE:{
Instruction*pc=&getcode(fs,e);
SETARG_A(*pc,reg);
break;
}
case VNONRELOC:{
if(reg!=e->u.s.info)
luaK_codeABC(fs,OP_MOVE,reg,e->u.s.info,0);
break;
}
default:{
return;
}
}
e->u.s.info=reg;
e->k=VNONRELOC;
}